

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O2

pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> * __thiscall
docopt::Argument::single_match
          (pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> *__return_storage_ptr__,
          Argument *this,PatternList *left)

{
  element_type *peVar1;
  int iVar2;
  long lVar3;
  undefined4 extraout_var;
  unsigned_long uVar4;
  pointer psVar5;
  long lVar6;
  __shared_ptr<docopt::Argument,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  (__return_storage_ptr__->second).
  super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __return_storage_ptr__->first = 0;
  (__return_storage_ptr__->second).
  super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  psVar5 = (left->
           super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)(left->
                super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)psVar5;
  uVar4 = 0;
  while( true ) {
    if (lVar6 >> 4 == uVar4) {
      return __return_storage_ptr__;
    }
    peVar1 = (psVar5->super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if ((peVar1 != (element_type *)0x0) &&
       (lVar3 = __dynamic_cast(peVar1,&Pattern::typeinfo,&typeinfo,0), lVar3 != 0)) break;
    uVar4 = uVar4 + 1;
    psVar5 = psVar5 + 1;
  }
  __return_storage_ptr__->first = uVar4;
  iVar2 = (*(this->super_LeafPattern).super_Pattern._vptr_Pattern[3])();
  std::make_shared<docopt::Argument,std::__cxx11::string_const&,docopt::value_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_40,
             (value *)CONCAT44(extraout_var,iVar2));
  std::__shared_ptr<docopt::LeafPattern,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<docopt::LeafPattern,(__gnu_cxx::_Lock_policy)2> *)
             &__return_storage_ptr__->second,&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<size_t, std::shared_ptr<LeafPattern>> Argument::single_match(PatternList const& left) const
	{
		std::pair<size_t, std::shared_ptr<LeafPattern>> ret {};

		for(size_t i = 0, size = left.size(); i < size; ++i)
		{
			auto arg = dynamic_cast<Argument const*>(left[i].get());
			if (arg) {
				ret.first = i;
				ret.second = std::make_shared<Argument>(name(), arg->getValue());
				break;
			}
		}

		return ret;
	}